

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O0

cdr * __thiscall neueda::cdr::operator=(cdr *this,cdr *obj)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *ppcVar3;
  cdr *in_RSI;
  cdr *in_RDI;
  key_type *in_stack_00000008;
  map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
  *in_stack_00000010;
  iterator itr;
  orderedItemMap *in_stack_ffffffffffffffc8;
  map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
  *in_stack_ffffffffffffffd0;
  mapped_type this_00;
  _Self local_20;
  _Self local_18 [3];
  
  if (in_RDI != in_RSI) {
    in_RDI->mNextIndex = in_RSI->mNextIndex;
    std::
    map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
    ::operator=(in_stack_ffffffffffffffd0,
                (map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
                 *)in_stack_ffffffffffffffc8);
    std::
    map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
    ::clear((map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
             *)0x113383);
    local_18[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
         ::begin((map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
                  *)in_stack_ffffffffffffffc8);
    while( true ) {
      local_20._M_node =
           (_Base_ptr)
           std::
           map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
           ::end((map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
                  *)in_stack_ffffffffffffffc8);
      bVar1 = std::operator!=(local_18,&local_20);
      if (!bVar1) break;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_neueda::cdrItem>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_neueda::cdrItem>_> *)0x1133c8);
      this_00 = &ppVar2->second;
      in_stack_ffffffffffffffc8 = &in_RDI->mOrdered;
      std::_Rb_tree_iterator<std::pair<const_int,_neueda::cdrItem>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_neueda::cdrItem>_> *)0x1133eb);
      ppcVar3 = std::
                map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
                ::operator[](in_stack_00000010,in_stack_00000008);
      *ppcVar3 = this_00;
      std::_Rb_tree_iterator<std::pair<const_int,_neueda::cdrItem>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_neueda::cdrItem>_> *)this_00);
    }
  }
  return in_RDI;
}

Assistant:

cdr&
cdr::operator= (const cdr& obj)
{
    if (this != &obj)
    {
        mNextIndex = obj.mNextIndex;
        mItems = obj.mItems;

        mOrdered.clear ();
        for (itemMap::iterator itr = mItems.begin();
             itr != mItems.end();
             ++itr)
        {
            mOrdered[itr->second.mIndex] = &itr->second;
        }
    }

    return *this;
}